

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<EnumDef>::relocate
          (QArrayDataPointer<EnumDef> *this,qsizetype offset,EnumDef **data)

{
  EnumDef *d_first;
  EnumDef *pEVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<EnumDef,long_long>(this->ptr,this->size,d_first);
  if (data != (EnumDef **)0x0) {
    pEVar1 = *data;
    if ((this->ptr <= pEVar1) && (pEVar1 < this->ptr + this->size)) {
      *data = pEVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }